

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNFetc.cpp
# Opt level: O1

void __thiscall NaPNFetcher::set_output(NaPNFetcher *this,int nDim,uint *piMap)

{
  uint *__dest;
  undefined4 *puVar1;
  ulong uVar2;
  
  NaPetriNode::check_tunable(&this->super_NaPetriNode);
  this->nOutDim = nDim;
  if (this->piOutMap != (uint *)0x0) {
    operator_delete__(this->piOutMap);
  }
  if ((long)this->nOutDim < 0) {
    this->piOutMap = (uint *)0x0;
  }
  else {
    if (piMap == (uint *)0x0) {
      puVar1 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar1 = 0;
      __cxa_throw(puVar1,&NaException::typeinfo,0);
    }
    __dest = (uint *)operator_new__((long)this->nOutDim << 2);
    this->piOutMap = __dest;
    if (0 < this->nOutDim) {
      uVar2 = 1;
      if (1 < this->nOutDim) {
        uVar2 = (ulong)(uint)this->nOutDim;
      }
      memcpy(__dest,piMap,uVar2 << 2);
      return;
    }
  }
  return;
}

Assistant:

void
NaPNFetcher::set_output (int nDim, const unsigned* piMap)
{
  check_tunable();

  nOutDim = nDim;
  delete[] piOutMap;

  if(nOutDim < 0)
    piOutMap = NULL;
  else if(NULL == piMap)
    throw(na_null_pointer);
  else
    {
      int	i;
      piOutMap = new unsigned[nOutDim];
      for(i = 0; i < nOutDim; ++i)
	piOutMap[i] = piMap[i];
    }
}